

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O1

MultisamplePixelBufferAccess *
rr::getSubregion(MultisamplePixelBufferAccess *__return_storage_ptr__,
                MultisamplePixelBufferAccess *access,int x,int y,int width,int height)

{
  PixelBufferAccess local_38;
  
  tcu::getSubregion(&local_38,&access->m_access,0,x,y,
                    (access->m_access).super_ConstPixelBufferAccess.m_size.m_data[0],width,height);
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_format =
       local_38.super_ConstPixelBufferAccess.m_format;
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data[2] =
       local_38.super_ConstPixelBufferAccess.m_size.m_data[2];
  *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data =
       local_38.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data =
       local_38.super_ConstPixelBufferAccess.m_pitch.m_data._0_8_;
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       local_38.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_data =
       local_38.super_ConstPixelBufferAccess.m_data;
  return __return_storage_ptr__;
}

Assistant:

MultisamplePixelBufferAccess getSubregion (const MultisamplePixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}